

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphOptimizations.cpp
# Opt level: O2

void __thiscall dg::pta::PSEquivalentNodesMerger::mergeCasts(PSEquivalentNodesMerger *this)

{
  pointer ppPVar1;
  PSNodeType PVar2;
  undefined8 *puVar3;
  PSNode *node1;
  pointer ppPVar4;
  long lVar5;
  ulong uVar6;
  unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *nodeptr;
  undefined8 *puVar7;
  
  puVar7 = *(undefined8 **)(*(long *)this + 0x10);
  puVar3 = *(undefined8 **)(*(long *)this + 0x18);
  do {
    if (puVar7 == puVar3) {
      return;
    }
    node1 = (PSNode *)*puVar7;
    if (node1 != (PSNode *)0x0) {
      PVar2 = node1->type;
      if (PVar2 == GEP) {
        if (node1[1]._vptr_PSNode == (_func_int **)0x0) goto LAB_00117e3b;
      }
      else if (PVar2 == CAST) {
LAB_00117e3b:
        ppPVar4 = (node1->super_SubgraphNode<dg::pta::PSNode>).operands.
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
LAB_00117e3f:
        merge(this,node1,*ppPVar4);
      }
      else if (PVar2 == PHI) {
        ppPVar4 = (node1->super_SubgraphNode<dg::pta::PSNode>).operands.
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar5 = (long)(node1->super_SubgraphNode<dg::pta::PSNode>).operands.
                      super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar4;
        if (lVar5 != 0) {
          uVar6 = 1;
          do {
            if ((ulong)(lVar5 >> 3) <= uVar6) goto LAB_00117e3f;
            ppPVar1 = ppPVar4 + uVar6;
            uVar6 = uVar6 + 1;
          } while (*ppPVar4 == *ppPVar1);
        }
      }
    }
    puVar7 = puVar7 + 1;
  } while( true );
}

Assistant:

void PSEquivalentNodesMerger::mergeCasts() {
    for (const auto &nodeptr : G->getNodes()) {
        if (!nodeptr)
            continue;

        PSNode *node = nodeptr.get();

        // cast is always 'a proxy' to the real value,
        // it does not change the pointers
        if (node->getType() == PSNodeType::CAST ||
            (node->getType() == PSNodeType::PHI && node->getOperandsNum() > 0 &&
             allOperandsAreSame(node))) {
            merge(node, node->getOperand(0));
        } else if (PSNodeGep *GEP = PSNodeGep::get(node)) {
            if (GEP->getOffset().isZero()) // GEP with 0 offest is cast
                merge(node, GEP->getSource());
        }
    }
}